

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

size_t gc_onestep(lua_State *L)

{
  MSize *pMVar1;
  uint uVar2;
  MSize MVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  GCRef *pGVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  GCobj *pGVar12;
  ulong uVar13;
  global_State *g;
  cTValue *o;
  ulong uVar14;
  long lVar15;
  undefined1 *puVar16;
  int local_40;
  
  uVar2 = (L->glref).ptr32;
  g = (global_State *)(ulong)uVar2;
  switch((g->gc).state) {
  case '\0':
    (g->gc).gray = 0;
    (g->gc).grayagain = 0;
    (g->gc).weak.gcptr32 = 0;
    pGVar12 = (GCobj *)(ulong)(g->mainthref).gcptr32;
    if (((pGVar12->gch).marked & 3) != 0) {
      gc_mark(g,pGVar12);
      pGVar12 = (GCobj *)(ulong)(g->mainthref).gcptr32;
    }
    if (((((GCobj *)(ulong)(uint)(pGVar12->pt).firstline)->gch).marked & 3) != 0) {
      gc_mark(g,(GCobj *)(ulong)(uint)(pGVar12->pt).firstline);
    }
    if (((g->registrytv).field_2.it + 0xd < 9) &&
       (pGVar12 = (GCobj *)(ulong)(g->registrytv).u32.lo, ((pGVar12->gch).marked & 3) != 0)) {
      gc_mark(g,pGVar12);
    }
    gc_mark_gcroot(g);
    (g->gc).state = '\x01';
    break;
  case '\x01':
    if ((g->gc).gray.gcptr32 != 0) {
      sVar10 = propagatemark(g);
      return sVar10;
    }
    (g->gc).state = '\x02';
    break;
  case '\x02':
    if ((g->jit_L).gcptr32 != 0) {
      return 0x7fffff00;
    }
    pGVar8 = &(g->uvhead).field_5.field_1.next;
    while (puVar16 = (undefined1 *)(ulong)pGVar8->gcptr32, &g->uvhead != (GCupval *)puVar16) {
      if ((((puVar16[4] & 7) == 0) && (((uint *)(ulong)*(uint *)(puVar16 + 0x10))[1] + 0xd < 9)) &&
         (pGVar12 = (GCobj *)(ulong)*(uint *)(ulong)*(uint *)(puVar16 + 0x10),
         ((pGVar12->gch).marked & 3) != 0)) {
        gc_mark(g,pGVar12);
      }
      pGVar8 = (GCRef *)(puVar16 + 0xc);
    }
    gc_propagate_gray(g);
    (g->gc).gray.gcptr32 = (g->gc).weak.gcptr32;
    (g->gc).weak.gcptr32 = 0;
    if ((L->marked & 3) != 0) {
      gc_mark(g,(GCobj *)L);
    }
    gc_traverse_trace(g,(GCtrace *)(g + 1));
    gc_mark_gcroot(g);
    gc_propagate_gray(g);
    (g->gc).gray.gcptr32 = (g->gc).grayagain.gcptr32;
    (g->gc).grayagain.gcptr32 = 0;
    gc_propagate_gray(g);
    sVar10 = lj_gc_separateudata(g,0);
    uVar4 = (g->gc).mmudata.gcptr32;
    pGVar12 = (GCobj *)(ulong)uVar4;
    if (pGVar12 != (GCobj *)0x0) {
      do {
        uVar5 = (pGVar12->gch).nextgc.gcptr32;
        pGVar12 = (GCobj *)(ulong)uVar5;
        (pGVar12->gch).marked = (g->gc).currentwhite & 3 | (pGVar12->gch).marked & 0xf8;
        gc_mark(g,pGVar12);
      } while (uVar5 != uVar4);
    }
    sVar11 = gc_propagate_gray(g);
    pGVar8 = &(g->gc).weak;
    while (uVar14 = (ulong)pGVar8->gcptr32, uVar14 != 0) {
      if ((*(byte *)(uVar14 + 4) & 0x10) != 0) {
        uVar4 = *(uint *)(uVar14 + 0x18);
        for (lVar15 = 0; (ulong)uVar4 << 3 != lVar15; lVar15 = lVar15 + 8) {
          uVar5 = *(uint *)(uVar14 + 8);
          iVar7 = gc_mayclear((cTValue *)((ulong)uVar5 + lVar15),1);
          if (iVar7 != 0) {
            *(undefined4 *)((ulong)uVar5 + 4 + lVar15) = 0xffffffff;
          }
        }
      }
      uVar4 = *(uint *)(uVar14 + 0x1c);
      if (uVar4 != 0) {
        uVar5 = *(uint *)(uVar14 + 0x14);
        for (uVar13 = 0; (uint)uVar13 <= uVar4; uVar13 = (ulong)((uint)uVar13 + 1)) {
          if (*(int *)((ulong)uVar5 + 4 + uVar13 * 0x18) != -1) {
            o = (cTValue *)(uVar13 * 0x18 + (ulong)uVar5);
            iVar7 = gc_mayclear(o + 1,0);
            if ((iVar7 != 0) || (iVar7 = gc_mayclear(o,1), iVar7 != 0)) {
              (o->field_2).it = 0xffffffff;
            }
          }
        }
      }
      pGVar8 = (GCRef *)(uVar14 + 0xc);
    }
    local_40 = (int)sVar10;
    bVar6 = (g->gc).currentwhite ^ 3;
    (g->gc).currentwhite = bVar6;
    (g->strempty).marked = bVar6;
    (g->gc).sweep.ptr32 = uVar2 + 0x30;
    (g->gc).estimate = (g->gc).total - ((int)sVar11 + local_40);
    (g->gc).state = '\x03';
    (g->gc).sweepstr = 0;
    break;
  case '\x03':
    MVar3 = (g->gc).total;
    uVar2 = (g->gc).sweepstr;
    (g->gc).sweepstr = uVar2 + 1;
    gc_sweep(g,g->strhash + uVar2,0x7fffff00);
    if (g->strmask < (g->gc).sweepstr) {
      (g->gc).state = '\x04';
    }
    pMVar1 = &(g->gc).estimate;
    *pMVar1 = *pMVar1 + ((g->gc).total - MVar3);
    return 10;
  case '\x04':
    MVar3 = (g->gc).total;
    pGVar8 = gc_sweep(g,(GCRef *)(ulong)(g->gc).sweep.ptr32,0x28);
    (g->gc).sweep.ptr32 = (uint32_t)pGVar8;
    pMVar1 = &(g->gc).estimate;
    *pMVar1 = *pMVar1 + ((g->gc).total - MVar3);
    if (*(int *)((ulong)pGVar8 & 0xffffffff) != 0) {
      return 400;
    }
    uVar2 = g->strmask;
    if ((0x1ff < uVar2) && (g->strnum <= uVar2 >> 2)) {
      lj_str_resize(L,uVar2 >> 1);
    }
    uVar2 = (g->tmpbuf).sz;
    if (0x40 < uVar2) {
      pcVar9 = (char *)lj_mem_realloc(L,(g->tmpbuf).buf,uVar2,uVar2 >> 1);
      (g->tmpbuf).buf = pcVar9;
      pMVar1 = &(g->tmpbuf).sz;
      *pMVar1 = *pMVar1 >> 1;
    }
    if ((g->gc).mmudata.gcptr32 != 0) {
      (g->gc).state = '\x05';
      (g->gc).nocdatafin = '\x01';
      return 400;
    }
    (g->gc).state = '\0';
    (g->gc).debt = 0;
    return 400;
  case '\x05':
    if ((g->gc).mmudata.gcptr32 != 0) {
      if ((g->jit_L).gcptr32 != 0) {
        return 0x7fffff00;
      }
      gc_finalize(L);
      uVar2 = (g->gc).estimate;
      if (uVar2 < 0x65) {
        return 100;
      }
      (g->gc).estimate = uVar2 - 100;
      return 100;
    }
    if ((g->gc).nocdatafin == '\0') {
      rehashtab(L,*(GCtab **)((ulong)(g->ctype_state).ptr32 + 0x20),&(g->nilnode).val);
    }
    (g->gc).state = '\0';
    (g->gc).debt = 0;
  }
  return 0;
}

Assistant:

static size_t gc_onestep(lua_State *L)
{
  global_State *g = G(L);
  switch (g->gc.state) {
  case GCSpause:
    gc_mark_start(g);  /* Start a new GC cycle by marking all GC roots. */
    return 0;
  case GCSpropagate:
    if (gcref(g->gc.gray) != NULL)
      return propagatemark(g);  /* Propagate one gray object. */
    g->gc.state = GCSatomic;  /* End of mark phase. */
    return 0;
  case GCSatomic:
    if (gcref(g->jit_L))  /* Don't run atomic phase on trace. */
      return LJ_MAX_MEM;
    atomic(g, L);
    g->gc.state = GCSsweepstring;  /* Start of sweep phase. */
    g->gc.sweepstr = 0;
    return 0;
  case GCSsweepstring: {
    MSize old = g->gc.total;
    gc_fullsweep(g, &g->strhash[g->gc.sweepstr++]);  /* Sweep one chain. */
    if (g->gc.sweepstr > g->strmask)
      g->gc.state = GCSsweep;  /* All string hash chains sweeped. */
    lua_assert(old >= g->gc.total);
    g->gc.estimate -= old - g->gc.total;
    return GCSWEEPCOST;
    }
  case GCSsweep: {
    MSize old = g->gc.total;
    setmref(g->gc.sweep, gc_sweep(g, mref(g->gc.sweep, GCRef), GCSWEEPMAX));
    lua_assert(old >= g->gc.total);
    g->gc.estimate -= old - g->gc.total;
    if (gcref(*mref(g->gc.sweep, GCRef)) == NULL) {
      gc_shrink(g, L);
      if (gcref(g->gc.mmudata)) {  /* Need any finalizations? */
	g->gc.state = GCSfinalize;
#if LJ_HASFFI
	g->gc.nocdatafin = 1;
#endif
      } else {  /* Otherwise skip this phase to help the JIT. */
	g->gc.state = GCSpause;  /* End of GC cycle. */
	g->gc.debt = 0;
      }
    }
    return GCSWEEPMAX*GCSWEEPCOST;
    }
  case GCSfinalize:
    if (gcref(g->gc.mmudata) != NULL) {
      if (gcref(g->jit_L))  /* Don't call finalizers on trace. */
	return LJ_MAX_MEM;
      gc_finalize(L);  /* Finalize one userdata object. */
      if (g->gc.estimate > GCFINALIZECOST)
	g->gc.estimate -= GCFINALIZECOST;
      return GCFINALIZECOST;
    }
#if LJ_HASFFI
    if (!g->gc.nocdatafin) lj_tab_rehash(L, ctype_ctsG(g)->finalizer);
#endif
    g->gc.state = GCSpause;  /* End of GC cycle. */
    g->gc.debt = 0;
    return 0;
  default:
    lua_assert(0);
    return 0;
  }
}